

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall llbuild::core::TaskInterface::discoveredDependency(TaskInterface *this,KeyType *key)

{
  BuildEngineImpl *this_00;
  BuildEngineDelegate *pBVar1;
  TaskInfo *pTVar2;
  KeyID id;
  Twine local_30;
  undefined4 extraout_var;
  
  this_00 = (BuildEngineImpl *)this->impl;
  pTVar2 = anon_unknown.dwarf_157793::BuildEngineImpl::getTaskInfo(this_00,(Task *)this->ctx);
  if (pTVar2 == (TaskInfo *)0x0) {
    __assert_fail("taskInfo && \"cannot request inputs for an unknown task\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x6f9,
                  "void (anonymous namespace)::BuildEngineImpl::taskDiscoveredDependency(Task *, const KeyType &)"
                 );
  }
  if (pTVar2->forRuleInfo->state == InProgressComputing) {
    id._value._0_4_ = (*(this_00->super_BuildDBDelegate)._vptr_BuildDBDelegate[2])(this_00,key);
    id._value._4_4_ = extraout_var;
    DependencyKeyIDs::push_back(&pTVar2->discoveredDependencies,id,false,false);
    return;
  }
  pBVar1 = this_00->delegate;
  llvm::Twine::Twine(&local_30,"invalid state for adding discovered dependency");
  (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&local_30);
  LOCK();
  (this_00->buildCancelled)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

void TaskInterface::discoveredDependency(const KeyType& key) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskDiscoveredDependency(task, key);
}